

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_LForward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  float fVar1;
  float fVar2;
  _ComplexT _Var3;
  char cVar4;
  complex<float> **ppcVar5;
  complex<float> *pcVar6;
  int iVar7;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar8;
  int iVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  complex<float> *pcVar14;
  undefined8 uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  long local_60;
  
  lVar12 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar7 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar9 = 0;
  if ((lVar12 == CONCAT44(extraout_var,iVar7)) &&
     ((cVar4 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed,
      cVar4 == '\x04' || (cVar4 == '\x01')))) {
    iVar7 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    iVar9 = 1;
    if (CONCAT44(extraout_var_00,iVar7) != 0 && -1 < extraout_var_00) {
      local_60 = -8;
      lVar12 = 0;
      do {
        if (0 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) {
          lVar13 = 0;
          lVar11 = 0;
          do {
            ppcVar5 = (this->fElem).fStore;
            pcVar6 = ppcVar5[lVar12 + 1];
            if ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar12) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar14 = ppcVar5[lVar12] + 1;
            fVar19 = 0.0;
            fVar20 = 0.0;
            if (pcVar14 < pcVar6) {
              puVar10 = (undefined8 *)
                        ((long)&B->fElem->_M_value +
                        (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar13
                        + local_60);
              do {
                fVar1 = *(float *)&pcVar14->_M_value;
                fVar2 = *(float *)((long)&pcVar14->_M_value + 4);
                uVar15 = *puVar10;
                fVar16 = (float)((ulong)uVar15 >> 0x20);
                fVar18 = fVar1 * (float)uVar15 + fVar16 * fVar2;
                fVar17 = fVar1 * fVar16 - (float)uVar15 * fVar2;
                if ((NAN(fVar18)) && (NAN(fVar17))) {
                  uVar15 = __mulsc3(fVar1,-fVar2,uVar15,fVar16);
                  fVar18 = (float)uVar15;
                  fVar17 = (float)((ulong)uVar15 >> 0x20);
                }
                fVar19 = fVar19 + fVar18;
                fVar20 = fVar20 + fVar17;
                pcVar14 = pcVar14 + 1;
                puVar10 = puVar10 + -1;
              } while (pcVar14 < pcVar6);
            }
            if (((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar12) ||
               ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar8 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11;
            _Var3 = B->fElem[lVar8 + lVar12]._M_value;
            B->fElem[lVar8 + lVar12]._M_value =
                 CONCAT44((float)(_Var3 >> 0x20) - fVar20,(float)_Var3 - fVar19);
            lVar11 = lVar11 + 1;
            lVar13 = lVar13 + 8;
          } while (lVar11 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
        }
        lVar12 = lVar12 + 1;
        local_60 = local_60 + 8;
      } while (lVar12 != CONCAT44(extraout_var_00,iVar7));
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU) )
        return( 0 );
    
    int64_t dimension =this->Dim();
    for ( int64_t k = 0; k < dimension; k++ ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
        }
    }
    return( 1 );
}